

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O2

void print_CFG(gen_ctx_t gen_ctx,int bb_p,int pressure_p,int insns_p,int insn_index_p,
              _func_void_gen_ctx_t_bb_t *bb_info_print_func)

{
  bb_insn_t_conflict bb_insn;
  MIR_insn_t_conflict insn;
  bb_t_conflict bb;
  MIR_insn_t_conflict pMVar1;
  uint uVar2;
  DLIST_MIR_insn_t *pDVar3;
  bb_t_conflict pbVar4;
  DLIST_bb_t *pDVar5;
  DLIST_bb_insn_t *pDVar6;
  
  if (gen_ctx->optimize_level == 0) {
    pbVar4 = (bb_t_conflict)0x0;
    pDVar3 = &((gen_ctx->curr_func_item->u).func)->insns;
    while (insn = pDVar3->head, insn != (MIR_insn_t_conflict)0x0) {
      if (bb_p != 0) {
        uVar2 = *(int *)&insn->field_0x18 - 0xa7;
        pMVar1 = insn;
        if ((uVar2 < 0xe) && ((0x2007U >> (uVar2 & 0x1f) & 1) != 0)) {
          pMVar1 = (MIR_insn_t_conflict)insn->data;
        }
        bb = (bb_t_conflict)pMVar1->data;
        if (bb != pbVar4) {
          fprintf((FILE *)gen_ctx->debug_file,"BB %3lu:\n",bb->index);
          output_in_edges(gen_ctx,bb);
          output_out_edges(gen_ctx,bb);
          pbVar4 = bb;
          if (bb_info_print_func != (_func_void_gen_ctx_t_bb_t *)0x0) {
            (*bb_info_print_func)(gen_ctx,bb);
            fputc(10,(FILE *)gen_ctx->debug_file);
          }
        }
      }
      if (insns_p != 0) {
        MIR_output_insn(gen_ctx->ctx,gen_ctx->debug_file,insn,(gen_ctx->curr_func_item->u).func,1);
      }
      pDVar3 = (DLIST_MIR_insn_t *)&(insn->insn_link).next;
    }
  }
  else {
    pDVar5 = &gen_ctx->curr_cfg->bbs;
    while (pbVar4 = pDVar5->head, pbVar4 != (bb_t_conflict)0x0) {
      if (bb_p != 0) {
        fprintf((FILE *)gen_ctx->debug_file,"BB %3lu",pbVar4->index);
        if (pressure_p != 0) {
          fprintf((FILE *)gen_ctx->debug_file," (pressure: int=%d, fp=%d)",
                  (ulong)(uint)pbVar4->max_int_pressure,(ulong)(uint)pbVar4->max_fp_pressure);
        }
        if (pbVar4->loop_node == (loop_node_t_conflict)0x0) {
          fputc(10,(FILE *)gen_ctx->debug_file);
        }
        else {
          fprintf((FILE *)gen_ctx->debug_file," (loop%3lu):\n",
                  (ulong)pbVar4->loop_node->parent->index);
        }
        output_in_edges(gen_ctx,pbVar4);
        output_out_edges(gen_ctx,pbVar4);
        if (bb_info_print_func != (_func_void_gen_ctx_t_bb_t *)0x0) {
          (*bb_info_print_func)(gen_ctx,pbVar4);
          fputc(10,(FILE *)gen_ctx->debug_file);
        }
      }
      if (insns_p != 0) {
        pDVar6 = &pbVar4->bb_insns;
        while (bb_insn = pDVar6->head, bb_insn != (bb_insn_t_conflict)0x0) {
          if (insn_index_p != 0) {
            fprintf((FILE *)gen_ctx->debug_file,"  %-5lu",(ulong)bb_insn->index);
          }
          print_bb_insn(gen_ctx,bb_insn,1);
          pDVar6 = (DLIST_bb_insn_t *)&(bb_insn->bb_insn_link).next;
        }
        fputc(10,(FILE *)gen_ctx->debug_file);
      }
      pDVar5 = (DLIST_bb_t *)&(pbVar4->bb_link).next;
    }
  }
  return;
}

Assistant:

static void print_CFG (gen_ctx_t gen_ctx, int bb_p, int pressure_p, int insns_p, int insn_index_p,
                       void (*bb_info_print_func) (gen_ctx_t, bb_t)) {
  bb_t bb, insn_bb;

  if (optimize_level == 0) {
    bb = NULL;
    for (MIR_insn_t insn = DLIST_HEAD (MIR_insn_t, curr_func_item->u.func->insns); insn != NULL;
         insn = DLIST_NEXT (MIR_insn_t, insn)) {
      if (bb_p && (insn_bb = get_insn_data_bb (insn)) != bb) {
        bb = insn_bb;
        fprintf (debug_file, "BB %3lu:\n", (unsigned long) bb->index);
        output_in_edges (gen_ctx, bb);
        output_out_edges (gen_ctx, bb);
        if (bb_info_print_func != NULL) {
          bb_info_print_func (gen_ctx, bb);
          fprintf (debug_file, "\n");
        }
      }
      if (insns_p) MIR_output_insn (gen_ctx->ctx, debug_file, insn, curr_func_item->u.func, TRUE);
    }
    return;
  }
  for (bb = DLIST_HEAD (bb_t, curr_cfg->bbs); bb != NULL; bb = DLIST_NEXT (bb_t, bb)) {
    if (bb_p) {
      fprintf (debug_file, "BB %3lu", (unsigned long) bb->index);
      if (pressure_p)
        fprintf (debug_file, " (pressure: int=%d, fp=%d)", bb->max_int_pressure,
                 bb->max_fp_pressure);
      if (bb->loop_node == NULL)
        fprintf (debug_file, "\n");
      else
        fprintf (debug_file, " (loop%3lu):\n", (unsigned long) bb->loop_node->parent->index);
      output_in_edges (gen_ctx, bb);
      output_out_edges (gen_ctx, bb);
      if (bb_info_print_func != NULL) {
        bb_info_print_func (gen_ctx, bb);
        fprintf (debug_file, "\n");
      }
    }
    if (insns_p) {
      for (bb_insn_t bb_insn = DLIST_HEAD (bb_insn_t, bb->bb_insns); bb_insn != NULL;
           bb_insn = DLIST_NEXT (bb_insn_t, bb_insn)) {
        if (insn_index_p) fprintf (debug_file, "  %-5lu", (unsigned long) bb_insn->index);
        print_bb_insn (gen_ctx, bb_insn, TRUE);
      }
      fprintf (debug_file, "\n");
    }
  }
}